

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void __thiscall testing::internal::AssertHelper::~AssertHelper(AssertHelper *this)

{
  AssertHelperData *pAVar1;
  
  pAVar1 = this->data_;
  if (pAVar1 != (AssertHelperData *)0x0) {
    std::__cxx11::string::~string((string *)&pAVar1->message);
  }
  operator_delete(pAVar1);
  return;
}

Assistant:

AssertHelper::~AssertHelper() { delete data_; }